

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(Curl_cfilter *cf,Curl_easy *data,_Bool nonblocking,_Bool *done)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  curl_trc_feat *pcVar3;
  ssl_peer *psVar4;
  ossl_ctx *octx;
  uint uVar5;
  int iVar6;
  uint uVar7;
  CURLcode CVar8;
  uint uVar9;
  timediff_t tVar10;
  uint *puVar11;
  ssl_config_data *psVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  SSL_CIPHER *c;
  char *pcVar16;
  char *pcVar17;
  ulong error;
  int *piVar18;
  BIO_METHOD *type;
  BIO *pBVar19;
  bool bVar20;
  char cVar21;
  uint uVar22;
  void *pvVar23;
  bool bVar24;
  bool bVar25;
  int psigtype_nid;
  uchar *neg_protocol;
  uint local_19c;
  _Bool *local_198;
  void *local_190;
  ulong local_188 [10];
  uchar *local_138;
  char acStack_130 [24];
  undefined8 local_118;
  
  pvVar23 = cf->ctx;
  uVar5 = Curl_conn_cf_get_socket(cf,data);
  *(undefined4 *)((long)pvVar23 + 0x58) = 0;
  if (*(int *)((long)pvVar23 + 0x50) == 2) {
    *done = true;
    return CURLE_OK;
  }
  CVar8 = CURLE_OK;
  local_198 = done;
  local_190 = pvVar23;
  if (*(int *)((long)pvVar23 + 0x54) != 0) goto LAB_0016def8;
  CVar8 = CURLE_OK;
  cVar21 = '\x01';
  tVar10 = Curl_timeleft(data,(curltime *)0x0,true);
  if (tVar10 < 0) {
    Curl_failf(data,"SSL connection timeout");
  }
  else {
    psVar4 = (ssl_peer *)cf->ctx;
    octx = (ossl_ctx *)psVar4[1].dispname;
    acStack_130[8] = '\0';
    acStack_130[9] = '\0';
    acStack_130[10] = '\0';
    acStack_130[0xb] = '\0';
    acStack_130[0xc] = '\0';
    acStack_130[0xd] = '\0';
    acStack_130[0xe] = '\0';
    acStack_130[0xf] = '\0';
    acStack_130[0x10] = '\0';
    acStack_130[0x11] = '\0';
    acStack_130[0x12] = '\0';
    acStack_130[0x13] = '\0';
    acStack_130[0x14] = '\0';
    acStack_130[0x15] = '\0';
    acStack_130[0x16] = '\0';
    acStack_130[0x17] = '\0';
    local_138 = (uchar *)0x0;
    acStack_130[0] = '\0';
    acStack_130[1] = '\0';
    acStack_130[2] = '\0';
    acStack_130[3] = '\0';
    acStack_130[4] = '\0';
    acStack_130[5] = '\0';
    acStack_130[6] = '\0';
    acStack_130[7] = '\0';
    local_118._0_1_ = '\0';
    local_118._1_3_ = 0;
    local_118._4_4_ = 0;
    if (((alpn_spec *)psVar4[1].hostname == (alpn_spec *)0x0) ||
       (CVar8 = Curl_alpn_to_proto_buf((alpn_proto_buf *)&local_138,(alpn_spec *)psVar4[1].hostname)
       , CVar8 == CURLE_OK)) {
      CVar8 = Curl_ossl_ctx_init(octx,cf,data,psVar4,3,(uchar *)&local_138,(long)local_118._4_4_,
                                 (Curl_ossl_ctx_setup_cb *)0x0,(void *)0x0,ossl_new_session_cb,cf);
      if (CVar8 == CURLE_OK) {
        type = (BIO_METHOD *)BIO_meth_new(0x401);
        if (type == (BIO_METHOD *)0x0) {
          octx->bio_method = (BIO_METHOD *)0x0;
        }
        else {
          BIO_meth_set_write(type,ossl_bio_cf_out_write);
          BIO_meth_set_read(type,ossl_bio_cf_in_read);
          BIO_meth_set_ctrl(type,ossl_bio_cf_ctrl);
          BIO_meth_set_create(type,ossl_bio_cf_create);
          BIO_meth_set_destroy(type);
          octx->bio_method = (BIO_METHOD *)type;
          pBVar19 = BIO_new(type);
          if (pBVar19 != (BIO *)0x0) {
            BIO_set_data(pBVar19,cf);
            BIO_up_ref(pBVar19);
            SSL_set0_rbio(octx->ssl,pBVar19);
            SSL_set0_wbio(octx->ssl,pBVar19);
            if (((((alpn_spec *)psVar4[1].hostname != (alpn_spec *)0x0) &&
                 (Curl_alpn_to_proto_str
                            ((alpn_proto_buf *)&local_138,(alpn_spec *)psVar4[1].hostname),
                 data != (Curl_easy *)0x0)) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                (0 < pcVar3->log_level)))) {
              Curl_infof(data,"ALPN: curl offers %s",&local_138);
            }
            *(undefined4 *)((long)&psVar4[2].hostname + 4) = 1;
            CVar8 = CURLE_OK;
            goto LAB_0016e823;
          }
        }
        CVar8 = CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      Curl_failf(data,"Error determining ALPN");
      CVar8 = CURLE_SSL_CONNECT_ERROR;
    }
LAB_0016e823:
    cVar21 = (CVar8 != CURLE_OK) * '\x02';
  }
  if (cVar21 == '\x02') {
    return CVar8;
  }
  if (cVar21 != '\0') {
    return CURLE_OPERATION_TIMEDOUT;
  }
LAB_0016def8:
  do {
    if (*(int *)((long)pvVar23 + 0x54) != 1) {
      if (*(int *)((long)pvVar23 + 0x54) == 2) {
        psVar4 = (ssl_peer *)cf->ctx;
        CVar8 = Curl_oss_check_peer_cert(cf,data,(ossl_ctx *)psVar4[1].dispname,psVar4);
        if (CVar8 != CURLE_OK) {
          return CVar8;
        }
        *(undefined4 *)((long)&psVar4[2].hostname + 4) = 3;
        CVar8 = CURLE_OK;
      }
      bVar25 = *(int *)((long)pvVar23 + 0x54) == 3;
      if (bVar25) {
        *(undefined4 *)((long)pvVar23 + 0x50) = 2;
      }
      *local_198 = bVar25;
      *(undefined4 *)((long)pvVar23 + 0x54) = 0;
      return CVar8;
    }
    tVar10 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar10 < 0) {
      Curl_failf(data,"SSL connection timeout");
      CVar8 = CURLE_OPERATION_TIMEDOUT;
      bVar25 = true;
    }
    else {
      if ((!nonblocking) && (uVar7 = *(uint *)((long)pvVar23 + 0x58), uVar7 != 0)) {
        iVar6 = Curl_socket_check(-(uint)((uVar7 & 1) == 0) | uVar5,-1,
                                  -(uint)((uVar7 & 2) == 0) | uVar5,tVar10);
        if (iVar6 < 0) {
          puVar11 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar11);
          CVar8 = CURLE_SSL_CONNECT_ERROR;
LAB_0016dfc7:
          bVar24 = false;
          bVar25 = true;
        }
        else {
          if (iVar6 == 0) {
            Curl_failf(data,"SSL connection timeout");
            CVar8 = CURLE_OPERATION_TIMEDOUT;
            goto LAB_0016dfc7;
          }
          bVar25 = false;
          bVar24 = true;
        }
        if (!bVar24) goto LAB_0016e5b3;
      }
      puVar1 = (undefined8 *)cf->ctx;
      puVar2 = (undefined8 *)puVar1[6];
      psVar12 = Curl_ssl_cf_get_config(cf,data);
      *(undefined4 *)(puVar1 + 0xb) = 0;
      ERR_clear_error();
      uVar7 = SSL_connect((SSL *)puVar2[1]);
      if ((*(byte *)((long)puVar2 + 0x25) & 1) == 0) {
        CVar8 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar2);
        if (CVar8 == CURLE_OK) {
          *(byte *)((long)puVar2 + 0x25) = *(byte *)((long)puVar2 + 0x25) | 1;
          goto LAB_0016e02f;
        }
      }
      else {
LAB_0016e02f:
        if (uVar7 == 1) {
          local_188[0] = local_188[0] & 0xffffffff00000000;
          *(undefined4 *)((long)puVar1 + 0x54) = 2;
          SSL_get_peer_signature_type_nid(puVar2[1],local_188);
          lVar13 = SSL_ctrl((SSL *)puVar2[1],0x86,0,(void *)0x0);
          pcVar14 = OBJ_nid2sn((uint)lVar13 & 0xffff);
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
              (0 < pcVar3->log_level)))) {
            pcVar15 = SSL_get_version((SSL *)puVar2[1]);
            c = SSL_get_current_cipher((SSL *)puVar2[1]);
            pcVar16 = SSL_CIPHER_get_name(c);
            if (pcVar14 == (char *)0x0) {
              pcVar14 = "[blank]";
            }
            pcVar17 = OBJ_nid2sn((int)local_188[0]);
            Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar15,pcVar16,pcVar14,pcVar17
                      );
          }
          if (puVar1[5] != 0) {
            SSL_get0_alpn_selected(puVar2[1],&local_138,&local_19c);
            CVar8 = Curl_alpn_set_negotiated(cf,data,local_138,(ulong)local_19c);
            goto LAB_0016e584;
          }
        }
        else {
          uVar9 = SSL_get_error((SSL *)puVar2[1],uVar7);
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
            pcVar3 = (data->state).feat;
            if (pcVar3 == (curl_trc_feat *)0x0) {
              if (cf != (Curl_cfilter *)0x0) goto LAB_0016e171;
            }
            else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_0016e171:
              if (0 < cf->cft->log_level) {
                Curl_trc_cf_infof(data,cf,"SSL_connect() -> err=%d, detail=%d",(ulong)uVar7,
                                  (ulong)uVar9);
              }
            }
          }
          if ((int)uVar9 < 9) {
            if (uVar9 != 2) {
              if (uVar9 != 3) {
LAB_0016e248:
                memset(&local_138,0,0x100);
                *(undefined4 *)((long)puVar1 + 0x54) = 1;
                error = ERR_get_error();
                uVar22 = (uint)error;
                bVar25 = (int)uVar22 < 0;
                uVar7 = 0x7fffffff;
                if (!bVar25) {
                  uVar7 = 0x7fffff;
                }
                uVar7 = uVar7 & uVar22;
                bVar24 = (uVar22 & 0xff800000) != 0xa000000;
                if ((bVar24 || bVar25) || ((uVar7 != 0x415 && (uVar7 != 0x86)))) {
                  ossl_strerror(error,(char *)&local_138,0x100);
                  bVar20 = (bVar24 || bVar25) || uVar7 != 0x45c;
                  CVar8 = CURLE_SSL_CONNECT_ERROR;
                  if ((!bVar24 && !bVar25) && uVar7 == 0x45c) {
                    CVar8 = CURLE_SSL_CLIENTCERT;
                  }
                }
                else {
                  lVar13 = SSL_get_verify_result((SSL *)puVar2[1]);
                  if (lVar13 == 0) {
                    acStack_130[8] = 'v';
                    acStack_130[9] = 'e';
                    acStack_130[10] = 'r';
                    acStack_130[0xb] = 'i';
                    acStack_130[0xc] = 'f';
                    acStack_130[0xd] = 'i';
                    acStack_130[0xe] = 'c';
                    acStack_130[0xf] = 'a';
                    acStack_130[0x10] = 't';
                    acStack_130[0x11] = 'i';
                    acStack_130[0x12] = 'o';
                    acStack_130[0x13] = 'n';
                    acStack_130[0x14] = ' ';
                    acStack_130[0x15] = 'f';
                    acStack_130[0x16] = 'a';
                    acStack_130[0x17] = 'i';
                    local_138 = (uchar *)0x74726563204c5353;
                    acStack_130[0] = 'i';
                    acStack_130[1] = 'f';
                    acStack_130[2] = 'i';
                    acStack_130[3] = 'c';
                    acStack_130[4] = 'a';
                    acStack_130[5] = 't';
                    acStack_130[6] = 'e';
                    acStack_130[7] = ' ';
                    local_118._0_4_ = 0x64656c;
                    CVar8 = CURLE_PEER_FAILED_VERIFICATION;
                    bVar20 = false;
                  }
                  else {
                    psVar12->certverifyresult = lVar13;
                    X509_verify_cert_error_string(lVar13);
                    bVar20 = false;
                    curl_msnprintf((char *)&local_138,0x100,"SSL certificate problem: %s");
                    CVar8 = CURLE_PEER_FAILED_VERIFICATION;
                  }
                }
                if ((error == 0) && (bVar20)) {
                  local_188[8] = 0;
                  local_188[9] = 0;
                  local_188[6] = 0;
                  local_188[7] = 0;
                  local_188[4] = 0;
                  local_188[5] = 0;
                  local_188[2] = 0;
                  local_188[3] = 0;
                  local_188[0] = 0;
                  local_188[1] = 0;
                  piVar18 = __errno_location();
                  if ((*piVar18 != 0) && (uVar9 == 5)) {
                    Curl_strerror(*piVar18,(char *)local_188,0x50);
                  }
                  pcVar14 = (char *)local_188;
                  if (((char)local_188[0] == '\0') && (pcVar14 = "SSL_ERROR unknown", uVar9 < 0xb))
                  {
                    pcVar14 = (&PTR_anon_var_dwarf_17b73c_00196c28)[uVar9];
                  }
                  Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",pcVar14,*puVar1,
                             (ulong)*(uint *)((long)puVar1 + 0x1c));
                }
                else {
                  Curl_failf(data,"%s",&local_138);
                }
                goto LAB_0016e584;
              }
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
                pcVar3 = (data->state).feat;
                if (pcVar3 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_0016e4b5;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_0016e4b5:
                  if (0 < cf->cft->log_level) {
                    Curl_trc_cf_infof(data,cf,"SSL_connect() -> want send");
                  }
                }
              }
              *(undefined4 *)(puVar1 + 0xb) = 2;
              goto LAB_0016e581;
            }
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
              pcVar3 = (data->state).feat;
              if (pcVar3 == (curl_trc_feat *)0x0) {
                if (cf != (Curl_cfilter *)0x0) goto LAB_0016e519;
              }
              else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_0016e519:
                if (0 < cf->cft->log_level) {
                  Curl_trc_cf_infof(data,cf,"SSL_connect() -> want recv");
                }
              }
            }
            *(undefined4 *)(puVar1 + 0xb) = 1;
          }
          else {
            if (uVar9 == 9) {
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
                pcVar3 = (data->state).feat;
                if (pcVar3 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_0016e54f;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_0016e54f:
                  if (0 < cf->cft->log_level) {
                    pcVar14 = "SSL_connect() -> want async";
LAB_0016e56c:
                    Curl_trc_cf_infof(data,cf,pcVar14);
                  }
                }
              }
            }
            else {
              if (uVar9 != 0xc) goto LAB_0016e248;
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
                pcVar3 = (data->state).feat;
                if (pcVar3 == (curl_trc_feat *)0x0) {
                  if (cf != (Curl_cfilter *)0x0) goto LAB_0016e4f2;
                }
                else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar3->log_level)) {
LAB_0016e4f2:
                  if (0 < cf->cft->log_level) {
                    pcVar14 = "SSL_connect() -> want retry_verify";
                    goto LAB_0016e56c;
                  }
                }
              }
            }
            *(undefined8 *)((long)puVar1 + 0x54) = 0x100000001;
          }
        }
LAB_0016e581:
        CVar8 = CURLE_OK;
      }
LAB_0016e584:
      bVar25 = true;
      pvVar23 = local_190;
      if ((CVar8 == CURLE_OK) && ((!nonblocking || (*(int *)((long)local_190 + 0x54) != 1)))) {
        bVar25 = false;
        CVar8 = CURLE_OK;
      }
    }
LAB_0016e5b3:
    if (bVar25) {
      if (!bVar25) {
        CVar8 = CURLE_OPERATION_TIMEDOUT;
      }
      return CVar8;
    }
  } while( true );
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
  int what;

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we are allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  while(ssl_connect_2 == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    /* if ssl is expecting something, check if it is available. */
    if(!nonblocking && connssl->io_need) {

      curl_socket_t writefd = (connssl->io_need & CURL_SSL_IO_NEED_SEND)?
                              sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = (connssl->io_need & CURL_SSL_IO_NEED_RECV)?
                             sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_SSL_CONNECT_ERROR;
        goto out;
      }
      if(0 == what) {
        /* timeout */
        failf(data, "SSL connection timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(cf, data);
    if(result || (nonblocking && (ssl_connect_2 == connssl->connecting_state)))
      goto out;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

out:
  return result;
}